

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.cpp
# Opt level: O1

string * __thiscall
tools::xar::serializeHeaderAsJSON_abi_cxx11_
          (string *__return_storage_ptr__,xar *this,XarHeader *header)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  long *plVar3;
  ulong uVar4;
  ulong *puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  char cVar9;
  long lVar10;
  string __str;
  ulong *local_2d0;
  ulong local_2c0;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  undefined4 uStack_298;
  undefined4 uStack_294;
  char *local_290;
  undefined8 local_288;
  char local_280;
  undefined7 uStack_27f;
  undefined8 uStack_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_270;
  long local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  long local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220;
  long lStack_218;
  long *local_210 [2];
  long local_200 [2];
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  char *local_150;
  undefined8 local_148;
  char local_140 [8];
  undefined8 uStack_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined8 uStack_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined8 uStack_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  long local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Alloc_hider local_40;
  size_type sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
  __val = *(ulong *)this;
  cVar9 = '\x01';
  if (9 < __val) {
    uVar4 = __val;
    cVar2 = '\x04';
    do {
      cVar9 = cVar2;
      if (uVar4 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_00108871;
      }
      if (uVar4 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_00108871;
      }
      if (uVar4 < 10000) goto LAB_00108871;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      cVar2 = cVar9 + '\x04';
    } while (bVar1);
    cVar9 = cVar9 + '\x01';
  }
LAB_00108871:
  local_290 = &local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long_long>(local_290,(uint)local_288,__val);
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"OFFSET","");
  local_150 = local_140;
  if (local_290 == &local_280) {
    uStack_138 = uStack_278;
  }
  else {
    local_150 = local_290;
  }
  local_148 = local_288;
  local_288 = 0;
  local_280 = '\0';
  local_290 = &local_280;
  std::operator+(&local_190,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_2a0 = *puVar5;
    uStack_298 = (undefined4)plVar3[3];
    uStack_294 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *puVar5;
    local_2b0 = (ulong *)*plVar3;
  }
  local_2a8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"UUID","");
  local_110 = &local_100;
  if (local_2b0 == &local_2a0) {
    uStack_f8 = CONCAT44(uStack_294,uStack_298);
  }
  else {
    local_110 = local_2b0;
  }
  local_100 = local_2a0;
  local_108 = local_2a8;
  local_2a8 = 0;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_2b0 = &local_2a0;
  std::operator+(&local_1b0,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x28))
  ;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_2c0 = *puVar5;
    uStack_2b8 = (undefined4)plVar3[3];
    uStack_2b4 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar5;
    local_2d0 = (ulong *)*plVar3;
  }
  lVar10 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"VERSION","");
  local_d0 = &local_c0;
  if (local_2d0 == &local_2c0) {
    uStack_b8 = CONCAT44(uStack_2b4,uStack_2b8);
  }
  else {
    local_d0 = local_2d0;
  }
  local_c0 = local_2c0;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_c8 = lVar10;
  std::operator+(&local_1d0,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x48))
  ;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(plVar3 + 2);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)*plVar3 == pvVar6) {
    local_260.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pvVar6->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_260.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)plVar3[3];
    local_260.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_270 = &local_260;
  }
  else {
    local_260.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pvVar6->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_270 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)*plVar3;
  }
  local_268 = plVar3[1];
  *plVar3 = (long)pvVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"XAREXEC_TARGET","");
  local_90 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80;
  if (local_270 == &local_260) {
    local_80._8_4_ =
         local_260.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    local_80._12_4_ =
         local_260.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  }
  else {
    local_90 = local_270;
  }
  local_80._0_8_ =
       local_260.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88 = local_268;
  local_268 = 0;
  local_260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_260.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  pvVar6 = local_270;
  local_270 = &local_260;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"\",\"","");
  join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_1f0,(xar *)local_210,(string *)(this + 0x68),pvVar6);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,0x10a96a);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_220 = *plVar7;
    lStack_218 = plVar3[3];
    local_240.field_2._M_allocated_capacity = (size_type)&local_220;
  }
  else {
    local_220 = *plVar7;
    local_240.field_2._M_allocated_capacity = (size_type)(long *)*plVar3;
  }
  local_240.field_2._8_8_ = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_240.field_2._M_local_buf);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar3 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3 == pbVar8) {
    local_240._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    local_240._M_string_length._0_4_ = (undefined4)plVar3[3];
    local_240._M_string_length._4_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_260.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_240;
  }
  else {
    local_240._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    local_260.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3;
  }
  local_248 = plVar3[1];
  *plVar3 = (long)pbVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"XAREXEC_TRAMPOLINE_NAMES","")
  ;
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
  if (local_260.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == &local_240) {
    sStack_38 = CONCAT44(local_240._M_string_length._4_4_,(undefined4)local_240._M_string_length);
    local_60.field_2._M_allocated_capacity = (size_type)pbVar8;
  }
  else {
    local_60.field_2._M_allocated_capacity =
         (size_type)
         local_260.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  local_40._M_p = local_240._M_dataplus._M_p;
  local_60.field_2._8_8_ = local_248;
  local_248 = 0;
  local_240._M_dataplus._M_p = local_240._M_dataplus._M_p & 0xffffffffffffff00;
  local_260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_240;
  if ((long *)local_240.field_2._M_allocated_capacity != &local_220) {
    operator_delete((void *)local_240.field_2._M_allocated_capacity,local_220 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,
                    (ulong)((long)&((local_260.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,CONCAT71(uStack_27f,local_280) + 1);
  }
  lVar10 = 0x28;
  do {
    if (1 < __return_storage_ptr__->_M_string_length) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,*(ulong *)((long)&local_1b0.field_2 + lVar10 + 8));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,*(ulong *)((long)local_170 + lVar10 + -8));
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0x168);
  lVar10 = -0x140;
  do {
    if (pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  pbVar8[-1].field_2._M_allocated_capacity) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pbVar8[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar8->_M_dataplus)._M_p + 1));
    }
    if (pbVar8 + -1 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        pbVar8[-2].field_2._M_allocated_capacity) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pbVar8[-2].field_2._M_allocated_capacity,
                      (ulong)(pbVar8[-1]._M_dataplus._M_p + 1));
    }
    pbVar8 = pbVar8 + -2;
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string serializeHeaderAsJSON(const XarHeader& header) noexcept {
  std::string ret = "{";
  for (const auto& [name, value] :
       std::initializer_list<std::pair<std::string, std::string>>{
           {kOffsetName, std::to_string(header.offset)},
           {kUuidName, "\"" + header.uuid + "\""},
           {kVersion, "\"" + header.version + "\""},
           {kXarexecTarget, "\"" + header.xarexecTarget + "\""},
           {kXarexecTrampolineNames,
            "[\"" + join("\",\"", header.xarexecTrampolineNames) + "\"]"}}) {
    if (ret.size() > 1) {
      ret += ",";
    }
    ret += "\"";
    ret += name;
    ret += "\":";
    ret += value;
  }
  ret += "}";
  return ret;
}